

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBScpp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  value_type vVar1;
  value_type vVar2;
  pthread_t __th;
  value_type pvVar3;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  int iVar7;
  ostream *poVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  size_type sVar10;
  reference pvVar11;
  size_type sVar12;
  thread_data *ptVar13;
  void *pvVar14;
  void *pvVar15;
  reference ppvVar16;
  ulong local_1c8;
  size_t j;
  result *tmp_res;
  size_t i_4;
  ulong uStack_1a8;
  int ret_1;
  size_t i_3;
  undefined1 local_198 [8];
  vector<void_*,_std::allocator<void_*>_> thread_res;
  ulong uStack_178;
  int ret;
  size_t i_2;
  pthread_t *tids;
  thread_data *td;
  size_t i_1;
  undefined1 local_150 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> job_offset;
  size_t i;
  undefined1 local_128 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> job_count;
  uint64_t tasks_num;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *kmers;
  undefined1 local_c8 [8];
  vector<window_info,_std::allocator<window_info>_> tasks;
  undefined1 local_90 [8];
  vector<chromosome_inf,_std::allocator<chromosome_inf>_> chr_inf;
  string kmer_db_path;
  uint local_28;
  uint local_24;
  uint64_t local_20;
  char **argv_local;
  int argc_local;
  
  deal_args((args_st *)&stack0xffffffffffffff98,argc,argv);
  poVar8 = std::operator<<((ostream *)&std::cerr,"kmer_db_path: ");
  poVar8 = std::operator<<(poVar8,(string *)&stack0xffffffffffffff98);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cerr,"reference_file_path: ");
  poVar8 = std::operator<<(poVar8,(string *)(kmer_db_path.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cerr,"threads: ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_28);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cerr,"kmer_size: ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_24);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cerr,"window_size: ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_20);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string
            ((string *)
             &tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (string *)(kmer_db_path.field_2._M_local_buf + 8));
  get_reference_inf((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_90,
                    (string *)
                    &tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::vector
            ((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)&kmers,
             (vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_90);
  produce_tasks_via_refernce
            ((vector<window_info,_std::allocator<window_info>_> *)local_c8,
             (vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)&kmers,local_20,
             (ulong)local_24);
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::~vector
            ((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)&kmers);
  std::__cxx11::string::string((string *)&tasks_num,(string *)&stack0xffffffffffffff98);
  pvVar9 = read_kmer_db_vector((string *)&tasks_num);
  std::__cxx11::string::~string((string *)&tasks_num);
  local_e8 = pvVar9;
  job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<window_info,_std::allocator<window_info>_>::size
                          ((vector<window_info,_std::allocator<window_info>_> *)local_c8);
  poVar8 = std::operator<<((ostream *)&std::cerr,"we total have ");
  poVar8 = (ostream *)
           std::ostream::operator<<
                     (poVar8,(ulong)job_count.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<(poVar8," tasks ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cerr,"calc tasknum");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,(ulong)local_28,
             (allocator<unsigned_long> *)((long)&i + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i + 7));
  job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    puVar5 = job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
    puVar6 = job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if ((pointer)(sVar10 - 1) <= puVar5) break;
    uVar4 = (ulong)job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage / (ulong)local_28;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                         (size_type)
                         job_offset.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    *pvVar11 = (long)(int)uVar4;
    poVar8 = std::operator<<((ostream *)&std::cerr,"\t");
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                         (size_type)
                         job_offset.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar8,*pvVar11);
    job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)job_offset.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,0);
  vVar1 = *pvVar11;
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,sVar12 - 1
                      );
  *pvVar11 = (long)puVar6 - vVar1 * (sVar10 - 1);
  poVar8 = std::operator<<((ostream *)&std::cerr,"\t");
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,sVar10 - 1
                      );
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar11);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<((ostream *)&std::cerr,"calc offset");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,(ulong)local_28,
             (allocator<unsigned_long> *)((long)&i_1 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,0);
  *pvVar11 = 0;
  poVar8 = std::operator<<((ostream *)&std::cerr,"\t");
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,0);
  std::ostream::operator<<(poVar8,*pvVar11);
  td = (thread_data *)0x1;
  while( true ) {
    ptVar13 = (thread_data *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
    if (ptVar13 <= td) break;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,
                         (size_type)((long)&td[-1].kmers + 7));
    vVar1 = *pvVar11;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                         (size_type)((long)&td[-1].kmers + 7));
    vVar2 = *pvVar11;
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,
                         (size_type)td);
    *pvVar11 = vVar1 + vVar2;
    poVar8 = std::operator<<((ostream *)&std::cerr,"\t");
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,
                         (size_type)td);
    std::ostream::operator<<(poVar8,*pvVar11);
    td = (thread_data *)&(td->reference).field_0x1;
  }
  poVar8 = std::operator<<((ostream *)&std::cerr,"\n");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cerr,"create threads");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  pvVar14 = calloc((ulong)local_28,0x48);
  pvVar15 = calloc((ulong)local_28,8);
  for (uStack_178 = 0; uStack_178 < local_28; uStack_178 = uStack_178 + 1) {
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                         uStack_178);
    *(value_type *)((long)pvVar14 + uStack_178 * 0x48 + 0x28) = *pvVar11;
    std::__cxx11::string::operator=
              ((string *)((long)pvVar14 + uStack_178 * 0x48),
               (string *)(kmer_db_path.field_2._M_local_buf + 8));
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,
                         uStack_178);
    *(value_type *)((long)pvVar14 + uStack_178 * 0x48 + 0x20) = *pvVar11;
    *(undefined1 **)((long)pvVar14 + uStack_178 * 0x48 + 0x38) = local_90;
    *(undefined1 **)((long)pvVar14 + uStack_178 * 0x48 + 0x30) = local_c8;
    *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
     ((long)pvVar14 + uStack_178 * 0x48 + 0x40) = local_e8;
    thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         pthread_create((pthread_t *)((long)pvVar15 + uStack_178 * 8),(pthread_attr_t *)0x0,
                        thread_func,(void *)((long)pvVar14 + uStack_178 * 0x48));
    if (thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"pthread_create error: error_code=");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,thread_res.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cerr,"waiting threads");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::allocator<void_*>::allocator((allocator<void_*> *)((long)&i_3 + 7));
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_198,(ulong)local_28,
             (allocator<void_*> *)((long)&i_3 + 7));
  std::allocator<void_*>::~allocator((allocator<void_*> *)((long)&i_3 + 7));
  for (uStack_1a8 = 0; uStack_1a8 < local_28; uStack_1a8 = uStack_1a8 + 1) {
    __th = *(pthread_t *)((long)pvVar15 + uStack_1a8 * 8);
    ppvVar16 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                         ((vector<void_*,_std::allocator<void_*>_> *)local_198,uStack_1a8);
    iVar7 = pthread_join(__th,ppvVar16);
    if (iVar7 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"pthread_join error: error_code=");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "seqname\tstart\tend\ttotal_kmers\tobserved_kmers\tvariations\tkmer_distance"
                          );
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  for (tmp_res = (result *)0x0; tmp_res < (result *)(ulong)local_28;
      tmp_res = (result *)&(tmp_res->seqname).field_0x1) {
    ppvVar16 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                         ((vector<void_*,_std::allocator<void_*>_> *)local_198,(size_type)tmp_res);
    pvVar3 = *ppvVar16;
    local_1c8 = 0;
    while( true ) {
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                           (size_type)tmp_res);
      if (*pvVar11 <= local_1c8) break;
      poVar8 = std::operator<<((ostream *)&std::cout,(string *)((long)pvVar3 + local_1c8 * 0x50));
      std::operator<<(poVar8,"\t");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(ulong *)((long)pvVar3 + local_1c8 * 0x50 + 0x20));
      std::operator<<(poVar8,"\t");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(ulong *)((long)pvVar3 + local_1c8 * 0x50 + 0x28));
      std::operator<<(poVar8,"\t");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(ulong *)((long)pvVar3 + local_1c8 * 0x50 + 0x30));
      std::operator<<(poVar8,"\t");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(ulong *)((long)pvVar3 + local_1c8 * 0x50 + 0x38));
      std::operator<<(poVar8,"\t");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(ulong *)((long)pvVar3 + local_1c8 * 0x50 + 0x40));
      std::operator<<(poVar8,"\t");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(ulong *)((long)pvVar3 + local_1c8 * 0x50 + 0x48));
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      local_1c8 = local_1c8 + 1;
    }
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_198);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  std::vector<window_info,_std::allocator<window_info>_>::~vector
            ((vector<window_info,_std::allocator<window_info>_> *)local_c8);
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::~vector
            ((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_90);
  args_st::~args_st((args_st *)&stack0xffffffffffffff98);
  return 0;
}

Assistant:

int main(int argc, char* argv[]){
    //load and check parameters
    auto [kmer_db_path, reference_file_path , threads , kmer_size, window_size] = deal_args(argc,argv);

    //log
    cerr << "kmer_db_path: " << kmer_db_path << endl;
    cerr << "reference_file_path: " << reference_file_path << endl;
    cerr << "threads: " << threads << endl;
    cerr << "kmer_size: " << kmer_size << endl;
    cerr << "window_size: " << window_size << endl;

    //deal reference file
    vector<chromosome_inf> chr_inf =  get_reference_inf(reference_file_path);


    //get tasks list
    vector<window_info> tasks =  produce_tasks_via_refernce(chr_inf,window_size,kmer_size);


    //get reference map,this is an alternative.
    //No significant speed improvement, increased memory usage.so discard
    // map<string, string> * ref = get_reference_map(reference_file_path);


    //read kmers database
    //method 1, slow in loading process,more mem usage.
    // KmerUint64Hash1* kmers =  read_kmer_db_hash(  kmer_db_path);  
    //method 2, slow in loading process
    // KmersSet * kmers = load_kmer_raw_file2(kmer_db_path, 10000, false);
    //method 3, low mem usage,more faster 
    vector<uint64_t> *kmers = read_kmer_db_vector(  kmer_db_path);   

    //Assigning Tasks
    uint64_t tasks_num = tasks.size();
    cerr << "we total have " <<  tasks_num<< " tasks "<<endl;

    //calc tasknum for each thread
    cerr<<"calc tasknum"<<endl;
    vector<uint64_t> job_count(threads);
    for(size_t i=0;i<job_count.size()-1;i++){
        job_count[i]=(int)(tasks_num/threads);
        cerr << "\t" << job_count[i]; //
    }
    job_count[job_count.size()-1] = tasks_num-(job_count[0]*(job_count.size()-1));
    cerr << "\t" << job_count[job_count.size()-1] << "\n";// 

    

    //calc task offset for each thread
    cerr<<"calc offset"<<endl;
    vector<uint64_t> job_offset(threads);
    job_offset[0]=0;
    cerr << "\t" << job_offset[0] ; //
    for(size_t i=1;i<job_offset.size();i++){
        job_offset[i]=job_offset[i-1] + job_count[i-1];
        cerr << "\t" << job_offset[i]; //
    }
    cerr <<"\n"<<endl;

    // create the threads 
    cerr<<"create threads"<<endl;
    struct thread_data * td = (struct thread_data *)calloc(threads,sizeof(thread_data));
    pthread_t * tids=(pthread_t *)calloc(threads,sizeof(pthread_t));
    for(size_t i = 0; i < threads; ++i)
    {
        (td+i)->jobcount = job_count[i];
        (td+i)->reference =reference_file_path ;
        (td+i)->joboffset = job_offset[i];
        // vector<chromosome_inf> &tmp_chr_inf = chr_inf;
        (td+i)->chr_inf = &chr_inf;
        // vector<window_info> &tmp_tasks = tasks;
        (td+i)->tasks = &tasks;
        (td+i)->kmers = kmers;
        // (td+i)->ref = ref;
        //参数依次是：创建的线程id，线程参数，调用的函数，传入的函数参数
        int ret = pthread_create(tids+i, NULL, thread_func,(void *)(td+i));
        if (ret != 0)
        {
            cerr << "pthread_create error: error_code=" << ret << endl;
        }
    }


    //thread join
    cerr<<"waiting threads"<<endl;
    vector<void *> thread_res(threads);
    for(size_t i = 0; i < threads; ++i)
    {
        int ret = pthread_join ( *(tids+i), &thread_res[i] );
        if (ret != 0)
        {
            cerr << "pthread_join error: error_code=" << ret << endl;
        }

    }
    
    cout << "seqname\tstart\tend\ttotal_kmers\tobserved_kmers\tvariations\tkmer_distance" << endl;

    for(size_t i = 0; i < threads; ++i)
    {
        struct result * tmp_res = (struct result *)thread_res[i];
        for (size_t j=0;j < job_count[i];j++){
            cout << (tmp_res+j)->seqname << "\t";
            cout << (tmp_res+j)->start << "\t";
            cout << (tmp_res+j)->end << "\t";
            cout << (tmp_res+j)->total_kmers << "\t";
            cout << (tmp_res+j)->observed_kmers << "\t";
            cout << (tmp_res+j)->variations << "\t";
            cout << (tmp_res+j)->kmer_distance << endl;
        }

    }

    return 0;
}